

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::CollectMemsetStElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  BasicBlock *block;
  code *pcVar1;
  bool bVar2;
  IRType type;
  SymID SVar3;
  uint uVar4;
  uint uVar5;
  Opnd *pOVar6;
  undefined4 *puVar7;
  IndirOpnd *this_00;
  RegOpnd *indexOpnd;
  RegOpnd *pRVar8;
  StackSym *pSVar9;
  GlobOptBlockData *this_01;
  Value *srcVal;
  FloatConstOpnd *pFVar10;
  IntConstOpnd *pIVar11;
  long value;
  AddrOpnd *pAVar12;
  JITTimeFunctionBody *this_02;
  char16 *pcVar13;
  char16 *pcVar14;
  Func *pFVar15;
  JitArenaAllocator *pJVar16;
  MemSetCandidate *this_03;
  MemSetCandidate *local_120;
  code *local_118;
  undefined8 local_110;
  TrackAllocData local_108;
  MemSetCandidate *local_e0;
  MemSetCandidate *memsetInfo;
  bool isIndexPreIncr;
  Instr *pIStack_d0;
  SymID inductionSymID;
  Instr *__instr__;
  char16 debugStringBuffer [42];
  BailoutConstantValue constant;
  RegOpnd *opnd;
  StackSym *srcSym;
  Opnd *srcDef;
  SymID baseSymID;
  RegOpnd *baseOp;
  Opnd *indexOp;
  IndirOpnd *dst;
  Loop *loop_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  pOVar6 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar6);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x7d5,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pOVar6 = IR::Instr::GetDst(instr);
  this_00 = IR::Opnd::AsIndirOpnd(pOVar6);
  indexOpnd = IR::IndirOpnd::GetIndexOpnd(this_00);
  pRVar8 = IR::IndirOpnd::GetBaseOpnd(this_00);
  pRVar8 = IR::Opnd::AsRegOpnd(&pRVar8->super_Opnd);
  bVar2 = IsAllowedForMemOpt(this,instr,true,pRVar8,&indexOpnd->super_Opnd);
  if (bVar2) {
    pSVar9 = IR::Opnd::GetStackSym(&pRVar8->super_Opnd);
    SVar3 = GetVarSymID(this,pSVar9);
    pOVar6 = IR::Instr::GetSrc1(instr);
    opnd = (RegOpnd *)0x0;
    bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
    if (bVar2) {
      pRVar8 = IR::Opnd::AsRegOpnd(pOVar6);
      block = this->currentBlock;
      this_01 = CurrentBlockData(this);
      srcVal = GlobOptBlockData::FindValue(this_01,&pRVar8->m_sym->super_Sym);
      bVar2 = OptIsInvariant(this,&pRVar8->super_Opnd,block,loop,srcVal,true,true);
      if (bVar2) {
        opnd = (RegOpnd *)IR::Opnd::GetStackSym(&pRVar8->super_Opnd);
      }
    }
    memset(debugStringBuffer + 0x28,0,0x10);
    bVar2 = IR::Opnd::IsFloatConstOpnd(pOVar6);
    if (bVar2) {
      pFVar10 = IR::Opnd::AsFloatConstOpnd(pOVar6);
      BailoutConstantValue::InitFloatConstValue
                ((BailoutConstantValue *)(debugStringBuffer + 0x28),pFVar10->m_value);
    }
    else {
      bVar2 = IR::Opnd::IsIntConstOpnd(pOVar6);
      if (bVar2) {
        pIVar11 = IR::Opnd::AsIntConstOpnd(pOVar6);
        value = IR::EncodableOpnd<long>::GetValue(&pIVar11->super_EncodableOpnd<long>);
        pIVar11 = IR::Opnd::AsIntConstOpnd(pOVar6);
        type = IR::Opnd::GetType(&pIVar11->super_Opnd);
        BailoutConstantValue::InitIntConstValue
                  ((BailoutConstantValue *)(debugStringBuffer + 0x28),value,type);
      }
      else {
        bVar2 = IR::Opnd::IsAddrOpnd(pOVar6);
        if (bVar2) {
          pAVar12 = IR::Opnd::AsAddrOpnd(pOVar6);
          BailoutConstantValue::InitVarConstValue
                    ((BailoutConstantValue *)(debugStringBuffer + 0x28),pAVar12->m_address);
        }
        else if (opnd == (RegOpnd *)0x0) {
          if ((DAT_01ec73ca & 1) != 0) {
            uVar4 = Func::GetSourceContextId(this->func);
            uVar5 = Func::GetLocalFunctionId(this->func);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
            if (!bVar2) {
              uVar4 = Func::GetSourceContextId(this->func);
              uVar5 = Func::GetLocalFunctionId(this->func);
              bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar4,uVar5);
              if (!bVar2) {
                return false;
              }
            }
            Output::Print(L"TRACE MemSet:");
            this_02 = Func::GetJITFunctionBody(this->func);
            pcVar13 = JITTimeFunctionBody::GetDisplayName(this_02);
            pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr__);
            uVar4 = Loop::GetLoopNumber(loop);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar4);
            Output::Print(L"Source is not an invariant");
            pIStack_d0 = instr;
            if (instr != (Instr *)0x0) {
              IR::Instr::DumpByteCodeOffset(instr);
            }
            if (pIStack_d0 != (Instr *)0x0) {
              pcVar13 = Js::OpCodeUtil::GetOpCodeName(pIStack_d0->m_opcode);
              Output::Print(L" (%s)",pcVar13);
            }
            Output::Print(L"\n");
            Output::Flush();
          }
          return false;
        }
      }
    }
    pSVar9 = IR::Opnd::GetStackSym(&indexOpnd->super_Opnd);
    if (pSVar9 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x800,"(indexOp->GetStackSym())","indexOp->GetStackSym()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pSVar9 = IR::Opnd::GetStackSym(&indexOpnd->super_Opnd);
    memsetInfo._4_4_ = GetVarSymID(this,pSVar9);
    bVar2 = IsSymIDInductionVariable(this,memsetInfo._4_4_,loop);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x802,"(IsSymIDInductionVariable(inductionSymID, loop))",
                         "IsSymIDInductionVariable(inductionSymID, loop)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    Loop::EnsureMemOpVariablesInitialized(loop);
    memsetInfo._3_1_ =
         JsUtil::
         BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,
                       (uint *)((long)&memsetInfo + 4));
    pFVar15 = Func::GetTopFunc(this->func);
    pJVar16 = pFVar15->m_fg->alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_108,(type_info *)&Loop::MemSetCandidate::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
               ,0x807);
    pJVar16 = (JitArenaAllocator *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar16,&local_108);
    local_118 = Memory::JitArenaAllocator::Alloc;
    local_110 = 0;
    this_03 = (MemSetCandidate *)new<Memory::JitArenaAllocator>(0x28,pJVar16,0x4e98c0);
    Loop::MemSetCandidate::MemSetCandidate(this_03);
    (this_03->super_MemOpCandidate).base = SVar3;
    (this_03->super_MemOpCandidate).index = memsetInfo._4_4_;
    *(undefined8 *)&this_03->constant = stack0xffffffffffffff90;
    (this_03->constant).u = (anon_union_8_3_5e50e90d_for_u)constant._0_8_;
    this_03->srcSym = (StackSym *)opnd;
    (this_03->super_MemOpCandidate).count = '\x01';
    (this_03->super_MemOpCandidate).bIndexAlreadyChanged = (bool)(memsetInfo._3_1_ & 1);
    local_120 = this_03;
    local_e0 = this_03;
    SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              (&loop->memOpInfo->candidates->
                super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>,
               (MemOpCandidate **)&local_120);
    return true;
  }
  return false;
}

Assistant:

bool
GlobOpt::CollectMemsetStElementI(IR::Instr *instr, Loop *loop)
{
    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();
    IR::Opnd *indexOp = dst->GetIndexOpnd();
    IR::RegOpnd *baseOp = dst->GetBaseOpnd()->AsRegOpnd();

    if (!IsAllowedForMemOpt(instr, true, baseOp, indexOp))
    {
        return false;
    }

    SymID baseSymID = GetVarSymID(baseOp->GetStackSym());

    IR::Opnd *srcDef = instr->GetSrc1();
    StackSym *srcSym = nullptr;
    if (srcDef->IsRegOpnd())
    {
        IR::RegOpnd* opnd = srcDef->AsRegOpnd();
        if (this->OptIsInvariant(opnd, this->currentBlock, loop, CurrentBlockData()->FindValue(opnd->m_sym), true, true))
        {
            srcSym = opnd->GetStackSym();
        }
    }

    BailoutConstantValue constant = {TyIllegal, 0};
    if (srcDef->IsFloatConstOpnd())
    {
        constant.InitFloatConstValue(srcDef->AsFloatConstOpnd()->m_value);
    }
    else if (srcDef->IsIntConstOpnd())
    {
        constant.InitIntConstValue(srcDef->AsIntConstOpnd()->GetValue(), srcDef->AsIntConstOpnd()->GetType());
    }
    else if (srcDef->IsAddrOpnd())
    {
        constant.InitVarConstValue(srcDef->AsAddrOpnd()->m_address);
    }
    else if(!srcSym)
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Source is not an invariant"));
        return false;
    }

    // Process the Index Operand
    Assert(indexOp->GetStackSym());
    SymID inductionSymID = GetVarSymID(indexOp->GetStackSym());
    Assert(IsSymIDInductionVariable(inductionSymID, loop));

    loop->EnsureMemOpVariablesInitialized();
    bool isIndexPreIncr = loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID);

    Loop::MemSetCandidate* memsetInfo = JitAnewStruct(this->func->GetTopFunc()->m_fg->alloc, Loop::MemSetCandidate);
    memsetInfo->base = baseSymID;
    memsetInfo->index = inductionSymID;
    memsetInfo->constant = constant;
    memsetInfo->srcSym = srcSym;
    memsetInfo->count = 1;
    memsetInfo->bIndexAlreadyChanged = isIndexPreIncr;
    loop->memOpInfo->candidates->Prepend(memsetInfo);
    return true;
}